

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiContext * ImGui::CreateContext(ImFontAtlas *shared_font_atlas)

{
  int *piVar1;
  ImGuiContext *this;
  
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  this = (ImGuiContext *)(*GImAllocatorAllocFunc)(0x3db8,GImAllocatorUserData);
  ImGuiContext::ImGuiContext(this,shared_font_atlas);
  if (GImGui == (ImGuiContext *)0x0) {
    GImGui = this;
  }
  Initialize(this);
  return this;
}

Assistant:

ImGuiContext* ImGui::CreateContext(ImFontAtlas* shared_font_atlas)
{
    ImGuiContext* ctx = IM_NEW(ImGuiContext)(shared_font_atlas);
    if (GImGui == NULL)
        SetCurrentContext(ctx);
    Initialize(ctx);
    return ctx;
}